

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O2

void __thiscall mocker::LexError::~LexError(LexError *this)

{
  CompileError::~CompileError(&this->super_CompileError);
  operator_delete(this,0x48);
  return;
}

Assistant:

LexError(Position beg, Position end) : CompileError(beg, end) {}